

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# WithColor.cpp
# Opt level: O0

raw_ostream * __thiscall
llvm::WithColor::error(WithColor *this,raw_ostream *OS,StringRef Prefix,bool DisableColors)

{
  StringRef Str;
  bool bVar1;
  raw_ostream *prVar2;
  WithColor local_48;
  raw_ostream *local_38;
  char *local_30;
  byte local_21;
  raw_ostream *prStack_20;
  bool DisableColors_local;
  raw_ostream *OS_local;
  StringRef Prefix_local;
  
  Prefix_local.Data = Prefix.Data;
  local_21 = (byte)Prefix.Length & 1;
  prStack_20 = (raw_ostream *)this;
  OS_local = OS;
  bVar1 = StringRef::empty((StringRef *)&OS_local);
  if (!bVar1) {
    local_38 = OS_local;
    local_30 = Prefix_local.Data;
    Str.Length = (size_t)Prefix_local.Data;
    Str.Data = (char *)OS_local;
    prVar2 = raw_ostream::operator<<(prStack_20,Str);
    raw_ostream::operator<<(prVar2,": ");
  }
  WithColor(&local_48,prStack_20,Error,(bool)(local_21 & 1));
  prVar2 = get(&local_48);
  prVar2 = raw_ostream::operator<<(prVar2,"error: ");
  ~WithColor(&local_48);
  return prVar2;
}

Assistant:

raw_ostream &WithColor::error(raw_ostream &OS, StringRef Prefix,
                              bool DisableColors) {
  if (!Prefix.empty())
    OS << Prefix << ": ";
  return WithColor(OS, HighlightColor::Error, DisableColors).get()
         << "error: ";
}